

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall
QComboBoxPrivateContainer::resizeEvent(QComboBoxPrivateContainer *this,QResizeEvent *e)

{
  int iVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QStyleOption myOpt;
  QStyleOptionComboBox opt;
  QStyleHintReturnMask local_108;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  QPalettePrivate *pQStack_d0;
  undefined1 *local_c8;
  QObject *pQStack_c0;
  QStyleOptionComboBox local_b8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_b8,0xaa,0x90);
  comboStyleOption(&local_b8,this);
  pQVar2 = QWidget::style(&this->combo->super_QWidget);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x19,&local_b8,this->combo,0);
  if (iVar1 == 0) {
    QWidget::clearMask((QWidget *)this);
  }
  else {
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_c0 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_d0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)&local_f8,1,0);
    QStyleOption::initFrom((QStyleOption *)&local_f8,(QWidget *)this);
    local_108.super_QStyleHintReturn = (QStyleHintReturn)&DAT_aaaaaaaaaaaaaaaa;
    local_108.region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QStyleHintReturnMask::QStyleHintReturnMask(&local_108);
    pQVar2 = QWidget::style(&this->combo->super_QWidget);
    iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))
                      (pQVar2,0x50,(QStyleOption *)&local_f8,this,&local_108);
    if (iVar1 != 0) {
      QWidget::setMask((QWidget *)this,&local_108.region);
    }
    QStyleHintReturnMask::~QStyleHintReturnMask(&local_108);
    QStyleOption::~QStyleOption((QStyleOption *)&local_f8);
  }
  QWidget::resizeEvent((QWidget *)this,e);
  QIcon::~QIcon(&local_b8.currentIcon);
  if (&(local_b8.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_b8.currentText.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::resizeEvent(QResizeEvent *e)
{
    QStyleOptionComboBox opt = comboStyleOption();
    if (combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo)) {
        QStyleOption myOpt;
        myOpt.initFrom(this);
        QStyleHintReturnMask mask;
        if (combo->style()->styleHint(QStyle::SH_Menu_Mask, &myOpt, this, &mask)) {
            setMask(mask.region);
        }
    } else {
        clearMask();
    }
    QFrame::resizeEvent(e);
}